

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseAssertTrapCommand(WastParser *this,CommandPtr *out_command)

{
  bool bVar1;
  Result RVar2;
  pointer pAVar3;
  pointer pAVar4;
  unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
  local_58;
  unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
  command_1;
  unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
  local_30;
  unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
  command;
  CommandPtr *out_command_local;
  WastParser *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
  .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_false>._M_head_impl.
  _4_4_ = Expect(this,Lpar);
  bVar1 = Failed(command._M_t.
                 super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
                 .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_false>.
                 _M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    command._M_t.
    super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
    .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_false>._M_head_impl.
    _0_4_ = Expect(this,AssertTrap);
    bVar1 = Failed(command._M_t.
                   super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
                   .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)6>_*,_false>.
                   _M_head_impl._0_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      bVar1 = PeekMatchLpar(this,Module);
      if (bVar1) {
        MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)6>>();
        pAVar3 = std::
                 unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
                 ::operator->(&local_30);
        RVar2 = ParseScriptModule(this,&pAVar3->module);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar3 = std::
                   unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
                   ::operator->(&local_30);
          command_1._M_t.
          super___uniq_ptr_impl<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)10>_*,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
          .super__Head_base<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)10>_*,_false>.
          _M_head_impl._4_4_ = ParseQuotedText(this,&pAVar3->text);
          bVar1 = Failed(command_1._M_t.
                         super___uniq_ptr_impl<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)10>_*,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                         .
                         super__Head_base<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)10>_*,_false>
                         ._M_head_impl._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                      ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)out_command,
                       &local_30);
            bVar1 = false;
          }
        }
        std::
        unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)6>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)6>_>_>
        ::~unique_ptr(&local_30);
        if (bVar1) {
          return (Result)this_local._4_4_;
        }
      }
      else {
        MakeUnique<wabt::AssertTrapCommandBase<(wabt::CommandType)10>>();
        pAVar4 = std::
                 unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                 ::operator->(&local_58);
        RVar2 = ParseAction(this,&pAVar4->action);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          pAVar4 = std::
                   unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
                   ::operator->(&local_58);
          RVar2 = ParseQuotedText(this,&pAVar4->text);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                      ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)out_command,
                       &local_58);
            bVar1 = false;
          }
        }
        std::
        unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)10>_>_>
        ::~unique_ptr(&local_58);
        if (bVar1) {
          return (Result)this_local._4_4_;
        }
      }
      RVar2 = Expect(this,Rpar);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseAssertTrapCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseAssertTrapCommand);
  EXPECT(Lpar);
  EXPECT(AssertTrap);
  if (PeekMatchLpar(TokenType::Module)) {
    auto command = MakeUnique<AssertUninstantiableCommand>();
    CHECK_RESULT(ParseScriptModule(&command->module));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  } else {
    auto command = MakeUnique<AssertTrapCommand>();
    CHECK_RESULT(ParseAction(&command->action));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  }
  EXPECT(Rpar);
  return Result::Ok;
}